

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

int mod2dense_equal(mod2dense *m1,mod2dense *m2)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int extraout_EAX;
  int iVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  FILE *pFVar15;
  uint uVar16;
  long extraout_RDX;
  ulong uVar17;
  long extraout_RDX_00;
  FILE *pFVar18;
  uint uVar19;
  int row;
  long lVar20;
  FILE *r;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  mod2entry *pmVar24;
  FILE *unaff_R14;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iStack_16c;
  FILE *pFStack_168;
  FILE *pFStack_160;
  code *pcStack_158;
  FILE *pFStack_148;
  FILE *pFStack_140;
  ulong uStack_138;
  uint uStack_a0;
  int iStack_9c;
  
  uVar2 = m1->n_rows;
  uVar13 = (ulong)uVar2;
  if (uVar2 == m2->n_rows) {
    uVar3 = m1->n_cols;
    if (uVar3 == m2->n_cols) {
      if (0 < (int)uVar3) {
        uVar13 = (ulong)(m1->n_words - 1);
        uVar22 = 0;
        do {
          uVar25 = 0;
          uVar21 = uVar25;
          if (1 < m1->n_words) {
            do {
              if (m1->col[uVar22][uVar25] != m2->col[uVar22][uVar25]) {
                return 0;
              }
              uVar25 = uVar25 + 1;
              uVar21 = uVar13;
            } while (uVar13 != uVar25);
          }
          if (((m2->col[uVar22][uVar21] ^ m1->col[uVar22][uVar21]) & ~(-1 << ((byte)uVar2 & 0x1f)))
              != 0) {
            return 0;
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar3);
      }
      return 1;
    }
  }
  mod2dense_equal_cold_1();
  uVar2 = ((FILE *)m1)->_flags;
  uVar22 = (ulong)uVar2;
  pFVar15 = (FILE *)m1;
  if (uVar2 == *(uint *)&((FILE *)m1)->field_0x4) {
    if (m2 != m1) {
      if ((((FILE *)m2)->_flags == uVar2) && (*(uint *)&((FILE *)m2)->field_0x4 == uVar2)) {
        uVar3 = *(uint *)&((FILE *)m1)->_IO_read_ptr;
        mod2dense_clear(m2);
        if (0 < (int)uVar2) {
          uVar19 = 0;
          do {
            mod2dense_set(m2,uVar19,uVar19,1);
            uVar19 = uVar19 + 1;
          } while (uVar2 != uVar19);
          if (0 < (int)uVar2) {
            uVar13 = 0;
            while( true ) {
              uVar25 = uVar13 >> 5 & 0x7ffffff;
              pmVar24 = (mod2entry *)((FILE *)m1)->_IO_read_end;
              uVar19 = 1 << ((byte)uVar13 & 0x1f);
              uVar21 = uVar13;
              while ((*(uint *)(*(long *)(&pmVar24->row + uVar21 * 2) + uVar25 * 4) & uVar19) == 0)
              {
                uVar21 = uVar21 + 1;
                if (uVar22 == uVar21) {
                  return 0;
                }
              }
              if (uVar2 == (uint)uVar21) break;
              uVar21 = uVar21 & 0xffffffff;
              if (uVar13 != uVar21) {
                uVar5 = *(undefined8 *)(&pmVar24->row + uVar13 * 2);
                *(undefined8 *)(&pmVar24->row + uVar13 * 2) =
                     *(undefined8 *)(&pmVar24->row + uVar21 * 2);
                *(undefined8 *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar21 * 2) =
                     uVar5;
                pmVar24 = (mod2entry *)((FILE *)m2)->_IO_read_end;
                uVar5 = *(undefined8 *)(&pmVar24->row + uVar13 * 2);
                *(undefined8 *)(&pmVar24->row + uVar13 * 2) =
                     *(undefined8 *)(&pmVar24->row + uVar21 * 2);
                *(undefined8 *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row + uVar21 * 2) =
                     uVar5;
              }
              uVar21 = 0;
              do {
                if (uVar21 != uVar13) {
                  lVar14 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row + uVar21 * 2);
                  if ((*(uint *)(lVar14 + uVar25 * 4) & uVar19) != 0) {
                    if ((int)uVar25 < (int)uVar3) {
                      lVar20 = *(long *)(&((mod2entry *)((FILE *)m1)->_IO_read_end)->row +
                                        uVar13 * 2);
                      uVar23 = uVar13 >> 5;
                      do {
                        puVar1 = (uint *)(lVar14 + uVar23 * 4);
                        *puVar1 = *puVar1 ^ *(uint *)(lVar20 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while ((uVar3 + (int)(uVar13 >> 5)) - (int)uVar25 != uVar23);
                    }
                    if (0 < (int)uVar3) {
                      lVar14 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row +
                                        uVar21 * 2);
                      lVar20 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row +
                                        uVar13 * 2);
                      uVar23 = 0;
                      do {
                        puVar1 = (uint *)(lVar14 + uVar23 * 4);
                        *puVar1 = *puVar1 ^ *(uint *)(lVar20 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                      } while (uVar3 != uVar23);
                    }
                  }
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != uVar22);
              uVar13 = uVar13 + 1;
              if (uVar13 == uVar22) {
                return 1;
              }
            }
            return 0;
          }
        }
        return 1;
      }
      mod2dense_invert_cold_2();
      unaff_R14 = (FILE *)m1;
      goto LAB_00123447;
    }
  }
  else {
LAB_00123447:
    m1 = (mod2dense *)unaff_R14;
    mod2dense_invert_cold_1();
  }
  mod2dense_invert_cold_3();
  r = (FILE *)m2;
  if ((FILE *)m2 != pFVar15) {
    uVar2 = pFVar15->_flags;
    if (((FILE *)m2)->_flags == uVar2) {
      uVar3 = *(uint *)&pFVar15->field_0x4;
      uVar21 = (ulong)uVar3;
      if (*(uint *)&((FILE *)m2)->field_0x4 == uVar3) {
        uVar19 = *(uint *)&pFVar15->_IO_read_ptr;
        uVar22 = (ulong)uVar19;
        mod2dense_clear(m2);
        auVar7 = _DAT_00127fa0;
        if (0 < (int)uVar2) {
          lVar14 = (ulong)uVar2 - 1;
          auVar26._8_4_ = (int)lVar14;
          auVar26._0_8_ = lVar14;
          auVar26._12_4_ = (int)((ulong)lVar14 >> 0x20);
          uVar25 = 0;
          auVar26 = auVar26 ^ _DAT_00127fa0;
          auVar29 = _DAT_00127f90;
          do {
            auVar28 = auVar29 ^ auVar7;
            if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                        auVar26._4_4_ < auVar28._4_4_) & 1)) {
              *(int *)(extraout_RDX + uVar25 * 4) = (int)uVar25;
            }
            if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
                auVar28._12_4_ <= auVar26._12_4_) {
              *(int *)(extraout_RDX + 4 + uVar25 * 4) = (int)uVar25 + 1;
            }
            uVar25 = uVar25 + 2;
            lVar14 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar14 + 2;
          } while ((uVar2 + 1 & 0xfffffffe) != uVar25);
        }
        auVar7 = _DAT_00127fa0;
        lVar14 = 0;
        uVar25 = 0;
        if (0 < (int)uVar3) {
          lVar20 = uVar21 - 1;
          auVar27._8_4_ = (int)lVar20;
          auVar27._0_8_ = lVar20;
          auVar27._12_4_ = (int)((ulong)lVar20 >> 0x20);
          uVar25 = 0;
          auVar27 = auVar27 ^ _DAT_00127fa0;
          auVar28 = _DAT_00127f90;
          do {
            auVar29 = auVar28 ^ auVar7;
            if ((bool)(~(auVar29._4_4_ == auVar27._4_4_ && auVar27._0_4_ < auVar29._0_4_ ||
                        auVar27._4_4_ < auVar29._4_4_) & 1)) {
              *(int *)(uVar13 + uVar25 * 4) = (int)uVar25;
            }
            if ((auVar29._12_4_ != auVar27._12_4_ || auVar29._8_4_ <= auVar27._8_4_) &&
                auVar29._12_4_ <= auVar27._12_4_) {
              *(int *)(uVar13 + 4 + uVar25 * 4) = (int)uVar25 + 1;
            }
            uVar25 = uVar25 + 2;
            lVar20 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 2;
            auVar28._8_8_ = lVar20 + 2;
          } while ((uVar3 + 1 & 0xfffffffe) != uVar25);
          uVar25 = (ulong)uVar3;
        }
        uVar23 = 0;
        do {
          uVar16 = uVar2 - (int)lVar14;
          uVar17 = (ulong)uVar16;
          if ((long)uVar23 < (long)(int)uVar16) {
            lVar14 = (long)(int)lVar14;
            do {
              uVar16 = *(uint *)(extraout_RDX + uVar23 * 4);
              iStack_9c = (int)uVar16 >> 5;
              uStack_a0 = uVar16 & 0x1f;
              uVar25 = uVar23 & 0xffffffff;
              if ((long)uVar23 < (long)(int)uVar3) {
                uVar25 = uVar23;
                do {
                  if ((*(uint *)(*(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                          (long)*(int *)(uVar13 + uVar25 * 4) * 2) +
                                (long)iStack_9c * 4) & 1 << (sbyte)uStack_a0) != 0)
                  goto LAB_00123677;
                  uVar25 = uVar25 + 1;
                } while (uVar21 != uVar25);
                uVar25 = (ulong)uVar3;
              }
              lVar14 = lVar14 + 1;
              uVar17 = (int)uVar2 - lVar14;
              *(undefined4 *)(extraout_RDX + uVar23 * 4) =
                   *(undefined4 *)(extraout_RDX + uVar17 * 4);
              *(uint *)(extraout_RDX + uVar17 * 4) = uVar16;
            } while ((long)uVar23 < (long)uVar17);
          }
LAB_00123677:
          if (uVar23 == (uVar17 & 0xffffffff)) {
            if ((int)uVar17 < (int)uVar2) {
              pmVar24 = (mod2entry *)((FILE *)m2)->_IO_read_end;
              lVar20 = (long)(int)uVar17;
              do {
                if (0 < (int)uVar19) {
                  memset(*(void **)(&pmVar24->row + (long)*(int *)(uVar13 + lVar20 * 4) * 2),0,
                         uVar22 * 4);
                }
                lVar20 = lVar20 + 1;
              } while ((int)uVar2 != lVar20);
            }
            return (int)lVar14;
          }
          uVar16 = *(uint *)(uVar13 + (long)(int)uVar25 * 4);
          *(undefined4 *)(uVar13 + (long)(int)uVar25 * 4) = *(undefined4 *)(uVar13 + uVar23 * 4);
          *(uint *)(uVar13 + uVar23 * 4) = uVar16;
          mod2dense_set(m2,*(int *)(extraout_RDX + uVar23 * 4),uVar16,1);
          if ((int)uVar3 < 1) {
            uVar25 = 0;
          }
          else {
            uVar25 = 0;
            do {
              if (uVar25 != uVar16) {
                lVar20 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row + uVar25 * 2);
                if (((*(uint *)(lVar20 + (long)iStack_9c * 4) & 1 << ((byte)uStack_a0 & 0x1f)) != 0)
                   && (0 < (int)uVar19)) {
                  lVar6 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                   (long)(int)uVar16 * 2);
                  uVar17 = 0;
                  do {
                    puVar1 = (uint *)(lVar20 + uVar17 * 4);
                    *puVar1 = *puVar1 ^ *(uint *)(lVar6 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar22 != uVar17);
                  if (0 < (int)uVar19) {
                    lVar20 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row + uVar25 * 2)
                    ;
                    lVar6 = *(long *)(&((mod2entry *)((FILE *)m2)->_IO_read_end)->row +
                                     (long)(int)uVar16 * 2);
                    uVar17 = 0;
                    do {
                      puVar1 = (uint *)(lVar20 + uVar17 * 4);
                      *puVar1 = *puVar1 ^ *(uint *)(lVar6 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar22 != uVar17);
                  }
                }
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar21);
            uVar25 = (ulong)uVar3;
          }
          uVar23 = uVar23 + 1;
        } while( true );
      }
    }
    mod2dense_invert_selected_cold_1();
    m1 = m2;
  }
  mod2dense_invert_selected_cold_2();
  uVar2 = pFVar15->_flags;
  pFVar18 = (FILE *)(ulong)uVar2;
  if (uVar2 == *(uint *)&pFVar15->field_0x4) {
    if (r == pFVar15) goto LAB_001239c7;
    if ((r->_flags == uVar2) && (*(uint *)&r->field_0x4 == uVar2)) {
      uVar3 = *(uint *)&pFVar15->_IO_read_ptr;
      mod2dense_clear((mod2dense *)r);
      if (0 < (int)uVar2) {
        uVar19 = 0;
        do {
          mod2dense_set((mod2dense *)r,uVar19,uVar19,1);
          uVar19 = uVar19 + 1;
        } while (uVar2 != uVar19);
        if (0 < (int)uVar2) {
          pFVar10 = (FILE *)0x0;
          do {
            *(undefined4 *)(extraout_RDX_00 + (long)pFVar10 * 4) = 0xffffffff;
            *(int *)(uVar13 + (long)pFVar10 * 4) = (int)pFVar10;
            pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
          } while (pFVar18 != pFVar10);
          if (0 < (int)uVar2) {
            pFVar10 = (FILE *)0x0;
            do {
              iVar8 = (int)pFVar10;
              uVar22 = (ulong)pFVar10 >> 5 & 0x7ffffff;
              pmVar24 = (mod2entry *)pFVar15->_IO_read_end;
              uVar19 = 1 << ((byte)pFVar10 & 0x1f);
              pFVar11 = pFVar10;
              do {
                if ((*(uint *)(*(long *)(&pmVar24->row + (long)pFVar11 * 2) + uVar22 * 4) & uVar19)
                    != 0) {
                  if (uVar2 != (uint)pFVar11) {
                    pFVar11 = (FILE *)((ulong)pFVar11 & 0xffffffff);
                    if (pFVar10 != pFVar11) {
                      uVar5 = *(undefined8 *)(&pmVar24->row + (long)pFVar10 * 2);
                      *(undefined8 *)(&pmVar24->row + (long)pFVar10 * 2) =
                           *(undefined8 *)(&pmVar24->row + (long)pFVar11 * 2);
                      *(undefined8 *)
                       (&((mod2entry *)pFVar15->_IO_read_end)->row + (long)pFVar11 * 2) = uVar5;
                      pmVar24 = (mod2entry *)r->_IO_read_end;
                      uVar5 = *(undefined8 *)(&pmVar24->row + (long)pFVar10 * 2);
                      *(undefined8 *)(&pmVar24->row + (long)pFVar10 * 2) =
                           *(undefined8 *)(&pmVar24->row + (long)pFVar11 * 2);
                      *(undefined8 *)(&((mod2entry *)r->_IO_read_end)->row + (long)pFVar11 * 2) =
                           uVar5;
                      uVar4 = *(undefined4 *)(uVar13 + (long)pFVar10 * 4);
                      *(undefined4 *)(uVar13 + (long)pFVar10 * 4) =
                           *(undefined4 *)(uVar13 + (long)pFVar11 * 4);
                      *(undefined4 *)(uVar13 + (long)pFVar11 * 4) = uVar4;
                    }
                    goto LAB_001238c8;
                  }
                  break;
                }
                pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
              } while (pFVar18 != pFVar11);
              mod2dense_set((mod2dense *)pFVar15,iVar8,iVar8,1);
              *(int *)(extraout_RDX_00 + (long)pFVar10 * 4) = iVar8;
LAB_001238c8:
              pFVar11 = (FILE *)0x0;
              do {
                if (pFVar11 != pFVar10) {
                  lVar14 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row + (long)pFVar11 * 2)
                  ;
                  if ((*(uint *)(lVar14 + uVar22 * 4) & uVar19) != 0) {
                    if ((int)uVar22 < (int)uVar3) {
                      lVar20 = *(long *)(&((mod2entry *)pFVar15->_IO_read_end)->row +
                                        (long)pFVar10 * 2);
                      uVar21 = (ulong)pFVar10 >> 5;
                      do {
                        puVar1 = (uint *)(lVar14 + uVar21 * 4);
                        *puVar1 = *puVar1 ^ *(uint *)(lVar20 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while ((uVar3 + (int)((ulong)pFVar10 >> 5)) - (int)uVar22 != uVar21);
                    }
                    if (0 < (int)uVar3) {
                      lVar14 = *(long *)(&((mod2entry *)r->_IO_read_end)->row + (long)pFVar11 * 2);
                      lVar20 = *(long *)(&((mod2entry *)r->_IO_read_end)->row + (long)pFVar10 * 2);
                      uVar21 = 0;
                      do {
                        puVar1 = (uint *)(lVar14 + uVar21 * 4);
                        *puVar1 = *puVar1 ^ *(uint *)(lVar20 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while (uVar3 != uVar21);
                    }
                  }
                }
                pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
              } while (pFVar11 != pFVar18);
              pFVar10 = (FILE *)((long)&pFVar10->_flags + 1);
            } while (pFVar10 != pFVar18);
            if (0 < (int)uVar2) {
              pFVar15 = (FILE *)0x0;
              iVar8 = 0;
              do {
                iVar9 = *(int *)(extraout_RDX_00 + (long)pFVar15 * 4);
                if (iVar9 != -1) {
                  *(int *)(extraout_RDX_00 + (long)iVar8 * 4) = iVar9;
                  *(undefined4 *)(uVar13 + (long)iVar8 * 4) =
                       *(undefined4 *)(uVar13 + (long)pFVar15 * 4);
                  iVar8 = iVar8 + 1;
                }
                pFVar15 = (FILE *)((long)&pFVar15->_flags + 1);
              } while (pFVar18 != pFVar15);
              return iVar8;
            }
          }
        }
      }
      return 0;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_001239c7:
  mod2dense_forcibly_invert_cold_3();
  if ((pFVar15->_flags <= r->_flags) &&
     (pFVar18 = r, m1 = (mod2dense *)pFVar15, *(int *)&pFVar15->field_0x4 <= *(int *)&r->field_0x4))
  {
    mod2dense_clear((mod2dense *)r);
    iVar8 = pFVar15->_flags;
    if (0 < iVar8) {
      lVar14 = 0;
      do {
        pmVar24 = ((mod2entry *)pFVar15->_IO_read_ptr)[lVar14].right;
        if (-1 < pmVar24->row) {
          do {
            mod2dense_set((mod2dense *)r,(int)lVar14,pmVar24->col,1);
            pmVar24 = pmVar24->right;
          } while (-1 < pmVar24->row);
          iVar8 = pFVar15->_flags;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar8);
    }
    return iVar8;
  }
  mod2sparse_to_dense_cold_1();
  pFVar10 = (FILE *)m1;
  pFStack_148 = pFVar18;
  pFStack_140 = (FILE *)m1;
  uStack_138 = uVar22;
  if ((pFVar15->_flags <= r->_flags) &&
     (pFVar18 = r, pFVar10 = pFVar15, *(int *)&pFVar15->field_0x4 <= *(int *)&r->field_0x4)) {
    pcStack_158 = (code *)0x123a71;
    mod2sparse_clear((mod2sparse *)r);
    iVar8 = pFVar15->_flags;
    iVar9 = extraout_EAX;
    if (0 < iVar8) {
      iVar9 = *(int *)&pFVar15->field_0x4;
      row = 0;
      do {
        if (0 < iVar9) {
          iVar8 = 0;
          do {
            pcStack_158 = (code *)0x123a92;
            iVar9 = mod2dense_get((mod2dense *)pFVar15,row,iVar8);
            if (iVar9 != 0) {
              pcStack_158 = (code *)0x123aa3;
              mod2sparse_insert((mod2sparse *)r,row,iVar8);
            }
            iVar8 = iVar8 + 1;
            iVar9 = *(int *)&pFVar15->field_0x4;
          } while (iVar8 < iVar9);
          iVar8 = pFVar15->_flags;
        }
        row = row + 1;
      } while (row < iVar8);
    }
    return iVar9;
  }
  pcStack_158 = intio_read;
  mod2dense_to_sparse_cold_1();
  lVar14 = 0;
  pFStack_168 = pFVar18;
  pFStack_160 = pFVar10;
  pcStack_158 = (code *)uVar22;
  do {
    sVar12 = fread((void *)((long)&iStack_16c + lVar14),1,1,pFVar15);
    if (sVar12 != 1) {
      return 0;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  return iStack_16c;
}

Assistant:

int mod2dense_equal
( mod2dense *m1,
  mod2dense *m2
)
{
  int k, j, w;
  mod2word m;

  if (mod2dense_rows(m1)!=mod2dense_rows(m2) 
   || mod2dense_cols(m1)!=mod2dense_cols(m2))
  { fprintf(stderr,"mod2dense_equal: Matrices have different dimensions\n");
    exit(1);
  }

  w = m1->n_words;

  /* Form a mask that has 1s in the lower bit positions corresponding to
     bits that contain information in the last word of a matrix column. */

  m = (1 << (mod2_wordsize - (w*mod2_wordsize-m1->n_rows))) - 1;
  
  for (j = 0; j<mod2dense_cols(m1); j++)
  {
    for (k = 0; k<w-1; k++)
    { if (m1->col[j][k] != m2->col[j][k]) return 0;
    }

    if ((m1->col[j][k]&m) != (m2->col[j][k]&m)) return 0;
  }

  return 1;
}